

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_pyr.h
# Opt level: O0

void vo::ManagedImagePyr<unsigned_short,_std::allocator<unsigned_short>_>::subsample
               (Image<const_unsigned_short> *img,Image<unsigned_short> *img_sub)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  unsigned_short *puVar8;
  unsigned_short *puVar9;
  unsigned_short *puVar10;
  unsigned_short *puVar11;
  unsigned_short *puVar12;
  int *piVar13;
  int *piVar14;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  int iVar18;
  int iVar19;
  size_t y;
  long lVar20;
  int iStack_cc;
  unsigned_short val;
  int val_int;
  int r_1;
  int *row_p2_1;
  int *row_p1_1;
  int *row_1;
  int *row_m1_1;
  int *row_m2_1;
  int c_1;
  int c;
  unsigned_short *row_p2;
  unsigned_short *row_p1;
  unsigned_short *row;
  unsigned_short *row_m1;
  unsigned_short *row_m2;
  undefined1 local_58 [4];
  int r;
  ManagedImage<int,_std::allocator<int>_> tmp;
  int kernel [5];
  Image<unsigned_short> *img_sub_local;
  Image<const_unsigned_short> *img_local;
  
  tmp.super_Image<int>.h = 0x400000001;
  ManagedImage<int,_std::allocator<int>_>::ManagedImage
            ((ManagedImage<int,_std::allocator<int>_> *)local_58,img_sub->h,img->w);
  for (row_m2._4_4_ = 0; row_m2._4_4_ < (int)img_sub->h; row_m2._4_4_ = row_m2._4_4_ + 1) {
    iVar6 = row_m2._4_4_ * 2 + -2;
    if (iVar6 < 1) {
      iVar6 = -iVar6;
    }
    puVar8 = Image<const_unsigned_short>::RowPtr(img,(long)iVar6);
    uVar5 = row_m2._4_4_ * 2 - 1;
    if ((int)uVar5 < 1) {
      uVar5 = -uVar5;
    }
    puVar9 = Image<const_unsigned_short>::RowPtr(img,(ulong)uVar5);
    puVar10 = Image<const_unsigned_short>::RowPtr(img,(long)(row_m2._4_4_ * 2));
    iVar6 = border101(row_m2._4_4_ * 2 + 1,(int)img->h);
    puVar11 = Image<const_unsigned_short>::RowPtr(img,(long)iVar6);
    iVar6 = border101(row_m2._4_4_ * 2 + 2,(int)img->h);
    puVar12 = Image<const_unsigned_short>::RowPtr(img,(long)iVar6);
    for (row_m2_1._4_4_ = 0; row_m2_1._4_4_ < (int)img->w; row_m2_1._4_4_ = row_m2_1._4_4_ + 1) {
      y = (size_t)row_m2_1._4_4_;
      iVar6 = (int)tmp.super_Image<int>.h * (uint)puVar8[y];
      iVar18 = tmp.super_Image<int>.h._4_4_ * (uint)puVar9[y];
      uVar1 = puVar10[y];
      uVar2 = puVar11[y];
      uVar3 = puVar12[y];
      piVar13 = Image<int>::operator()((Image<int> *)local_58,(long)row_m2._4_4_,y);
      *piVar13 = iVar6 + iVar18 + (uint)uVar1 * 6 + (uint)uVar2 * 4 + (uint)uVar3;
    }
  }
  for (row_m2_1._0_4_ = 0; (int)row_m2_1 < (int)img_sub->w; row_m2_1._0_4_ = (int)row_m2_1 + 1) {
    iVar6 = (int)row_m2_1 * 2 + -2;
    if (iVar6 < 1) {
      iVar6 = -iVar6;
    }
    piVar13 = Image<int>::RowPtr((Image<int> *)local_58,(long)iVar6);
    uVar5 = (int)row_m2_1 * 2 - 1;
    if ((int)uVar5 < 1) {
      uVar5 = -uVar5;
    }
    piVar14 = Image<int>::RowPtr((Image<int> *)local_58,(ulong)uVar5);
    piVar15 = Image<int>::RowPtr((Image<int> *)local_58,(long)((int)row_m2_1 * 2));
    iVar6 = border101((int)row_m2_1 * 2 + 1,(int)tmp.super_Image<int>.w);
    piVar16 = Image<int>::RowPtr((Image<int> *)local_58,(long)iVar6);
    iVar6 = border101((int)row_m2_1 * 2 + 2,(int)tmp.super_Image<int>.w);
    piVar17 = Image<int>::RowPtr((Image<int> *)local_58,(long)iVar6);
    for (iStack_cc = 0; iStack_cc < (int)tmp.super_Image<int>.ptr; iStack_cc = iStack_cc + 1) {
      lVar20 = (long)iStack_cc;
      iVar7 = (int)tmp.super_Image<int>.h * piVar13[lVar20];
      iVar19 = tmp.super_Image<int>.h._4_4_ * piVar14[lVar20];
      iVar6 = piVar15[lVar20];
      iVar18 = piVar16[lVar20];
      iVar4 = piVar17[lVar20];
      puVar8 = Image<unsigned_short>::operator()(img_sub,(long)(int)row_m2_1,(long)iStack_cc);
      *puVar8 = (unsigned_short)
                ((uint)(iVar7 + iVar19 + iVar6 * 6 + iVar18 * 4 + iVar4 + 0x80) >> 8);
    }
  }
  ManagedImage<int,_std::allocator<int>_>::~ManagedImage
            ((ManagedImage<int,_std::allocator<int>_> *)local_58);
  return;
}

Assistant:

static void subsample(const Image<const T>& img, Image<T>& img_sub) {
    static_assert(std::is_same<T, uint16_t>::value ||
                  std::is_same<T, uint8_t>::value);

    constexpr int kernel[5] = {1, 4, 6, 4, 1};

    // accumulator
    ManagedImage<int> tmp(img_sub.h, img.w);

    // Vertical convolution
    {
      for (int r = 0; r < int(img_sub.h); r++) {
        const T* row_m2 = img.RowPtr(std::abs(2 * r - 2));
        const T* row_m1 = img.RowPtr(std::abs(2 * r - 1));
        const T* row = img.RowPtr(2 * r);
        const T* row_p1 = img.RowPtr(border101(2 * r + 1, img.h));
        const T* row_p2 = img.RowPtr(border101(2 * r + 2, img.h));

        for (int c = 0; c < int(img.w); c++) {
          tmp(r, c) = kernel[0] * int(row_m2[c]) + kernel[1] * int(row_m1[c]) +
                      kernel[2] * int(row[c]) + kernel[3] * int(row_p1[c]) +
                      kernel[4] * int(row_p2[c]);
        }
      }
    }

    // Horizontal convolution
    {
      for (int c = 0; c < int(img_sub.w); c++) {
        const int* row_m2 = tmp.RowPtr(std::abs(2 * c - 2));
        const int* row_m1 = tmp.RowPtr(std::abs(2 * c - 1));
        const int* row = tmp.RowPtr(2 * c);
        const int* row_p1 = tmp.RowPtr(border101(2 * c + 1, tmp.h));
        const int* row_p2 = tmp.RowPtr(border101(2 * c + 2, tmp.h));

        for (int r = 0; r < int(tmp.w); r++) {
          int val_int = kernel[0] * row_m2[r] + kernel[1] * row_m1[r] +
                        kernel[2] * row[r] + kernel[3] * row_p1[r] +
                        kernel[4] * row_p2[r];
          T val = ((val_int + (1 << 7)) >> 8);
          img_sub(c, r) = val;
        }
      }
    }
  }